

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall FPolyObj::LinkPolyobj(FPolyObj *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  side_t **ppsVar4;
  FPolyObj *pFVar5;
  polyblock_t *ppVar6;
  bool bVar7;
  double dVar8;
  int local_58;
  int local_54;
  int i_1;
  int j;
  DVector2 local_40;
  vertex_t *local_30;
  vertex_t *vt;
  FPolyObj *pFStack_20;
  uint i;
  polyblock_t *tempLink;
  polyblock_t **link;
  FPolyObj *this_local;
  
  link = (polyblock_t **)this;
  FBoundingBox::ClearBox(&this->Bounds);
  for (vt._4_4_ = 0; uVar1 = vt._4_4_, uVar2 = TArray<side_t_*,_side_t_*>::Size(&this->Sidedefs),
      uVar1 < uVar2; vt._4_4_ = vt._4_4_ + 1) {
    ppsVar4 = TArray<side_t_*,_side_t_*>::operator[](&this->Sidedefs,(ulong)vt._4_4_);
    local_30 = (*ppsVar4)->linedef->v1;
    vertex_t::fPos((vertex_t *)&local_40);
    FBoundingBox::AddToBox(&this->Bounds,&local_40);
    ppsVar4 = TArray<side_t_*,_side_t_*>::operator[](&this->Sidedefs,(ulong)vt._4_4_);
    local_30 = (*ppsVar4)->linedef->v2;
    vertex_t::fPos((vertex_t *)&i_1);
    FBoundingBox::AddToBox(&this->Bounds,(DVector2 *)&i_1);
  }
  dVar8 = FBoundingBox::Right(&this->Bounds);
  iVar3 = GetBlockX(dVar8);
  this->bbox[3] = iVar3;
  dVar8 = FBoundingBox::Left(&this->Bounds);
  iVar3 = GetBlockX(dVar8);
  this->bbox[2] = iVar3;
  dVar8 = FBoundingBox::Top(&this->Bounds);
  iVar3 = GetBlockY(dVar8);
  this->bbox[0] = iVar3;
  dVar8 = FBoundingBox::Bottom(&this->Bounds);
  iVar3 = GetBlockY(dVar8);
  this->bbox[1] = iVar3;
  for (local_54 = this->bbox[1] * bmapwidth; local_54 <= this->bbox[0] * bmapwidth;
      local_54 = bmapwidth + local_54) {
    for (local_58 = this->bbox[2]; local_58 <= this->bbox[3]; local_58 = local_58 + 1) {
      if ((((-1 < local_58) && (local_58 < bmapwidth)) && (-1 < local_54)) &&
         (local_54 < bmapheight * bmapwidth)) {
        tempLink = (polyblock_t *)(PolyBlockMap + (local_54 + local_58));
        if (tempLink->polyobj == (FPolyObj *)0x0) {
          pFVar5 = (FPolyObj *)operator_new(0x18);
          tempLink->polyobj = pFVar5;
          (tempLink->polyobj->Linedefs).Array = (line_t_conflict **)0x0;
          pFVar5 = tempLink->polyobj;
          (pFVar5->Sidedefs).Most = 0;
          (pFVar5->Sidedefs).Count = 0;
          (tempLink->polyobj->Sidedefs).Array = (side_t **)this;
        }
        else {
          pFStack_20 = tempLink->polyobj;
          while( true ) {
            bVar7 = false;
            if ((polyblock_t *)(pFStack_20->Linedefs).Array != (polyblock_t *)0x0) {
              bVar7 = (FPolyObj *)(pFStack_20->Sidedefs).Array != (FPolyObj *)0x0;
            }
            if (!bVar7) break;
            pFStack_20 = (FPolyObj *)(pFStack_20->Linedefs).Array;
          }
          if ((FPolyObj *)(pFStack_20->Sidedefs).Array == (FPolyObj *)0x0) {
            (pFStack_20->Sidedefs).Array = (side_t **)this;
          }
          else {
            ppVar6 = (polyblock_t *)operator_new(0x18);
            (pFStack_20->Linedefs).Array = (line_t_conflict **)ppVar6;
            ((polyblock_t *)(pFStack_20->Linedefs).Array)->next = (polyblock_t *)0x0;
            ((polyblock_t *)(pFStack_20->Linedefs).Array)->prev = (polyblock_t *)pFStack_20;
            ((polyblock_t *)(pFStack_20->Linedefs).Array)->polyobj = this;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void FPolyObj::LinkPolyobj ()
{
	polyblock_t **link;
	polyblock_t *tempLink;

	// calculate the polyobj bbox
	Bounds.ClearBox();
	for(unsigned i = 0; i < Sidedefs.Size(); i++)
	{
		vertex_t *vt;
		
		vt = Sidedefs[i]->linedef->v1;
		Bounds.AddToBox(vt->fPos());
		vt = Sidedefs[i]->linedef->v2;
		Bounds.AddToBox(vt->fPos());
	}
	bbox[BOXRIGHT] = GetBlockX(Bounds.Right());
	bbox[BOXLEFT] = GetBlockX(Bounds.Left());
	bbox[BOXTOP] = GetBlockY(Bounds.Top());
	bbox[BOXBOTTOM] = GetBlockY(Bounds.Bottom());
	// add the polyobj to each blockmap section
	for(int j = bbox[BOXBOTTOM]*bmapwidth; j <= bbox[BOXTOP]*bmapwidth;
		j += bmapwidth)
	{
		for(int i = bbox[BOXLEFT]; i <= bbox[BOXRIGHT]; i++)
		{
			if(i >= 0 && i < bmapwidth && j >= 0 && j < bmapheight*bmapwidth)
			{
				link = &PolyBlockMap[j+i];
				if(!(*link))
				{ // Create a new link at the current block cell
					*link = new polyblock_t;
					(*link)->next = NULL;
					(*link)->prev = NULL;
					(*link)->polyobj = this;
					continue;
				}
				else
				{
					tempLink = *link;
					while(tempLink->next != NULL && tempLink->polyobj != NULL)
					{
						tempLink = tempLink->next;
					}
				}
				if(tempLink->polyobj == NULL)
				{
					tempLink->polyobj = this;
					continue;
				}
				else
				{
					tempLink->next = new polyblock_t;
					tempLink->next->next = NULL;
					tempLink->next->prev = tempLink;
					tempLink->next->polyobj = this;
				}
			}
			// else, don't link the polyobj, since it's off the map
		}
	}
}